

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_BadEnumName_Test::~FeaturesTest_BadEnumName_Test
          (FeaturesTest_BadEnumName_Test *this)

{
  FeaturesTest_BadEnumName_Test *this_local;
  
  ~FeaturesTest_BadEnumName_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(FeaturesTest, BadEnumName) {
  BuildDescriptorMessagesInTestPool();

  pool_.EnforceNamingStyle(true);

  ParseAndBuildFileWithErrorSubstr("naming.proto", R"schema(
    edition = "2024";
    package naming;
    enum bad_enum { UNKNOWN = 0;}
  )schema",
                                   "Enum name bad_enum should be TitleCase");
}